

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O2

shared_ptr<kratos::StmtBlock> __thiscall
kratos::RemoveEmptyBlockVisitor::process
          (RemoveEmptyBlockVisitor *this,shared_ptr<kratos::StmtBlock> *stmt)

{
  long lVar1;
  long lVar2;
  _func_int **pp_Var3;
  pointer psVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  uint64_t *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<kratos::Stmt> *st_1;
  undefined1 auVar6 [8];
  uint64_t uVar7;
  shared_ptr<kratos::StmtBlock> sVar8;
  undefined1 local_90 [8];
  shared_ptr<kratos::Stmt> st;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  shared_ptr<kratos::Stmt> *local_70;
  undefined1 auStack_68 [8];
  vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
  stmts_to_remove;
  shared_ptr<kratos::Stmt> r;
  
  lVar1 = *(long *)(*in_RDX + 200);
  lVar2 = *(long *)(*in_RDX + 0xc0);
  stmts_to_remove.
  super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_68 = (undefined1  [8])0x0;
  stmts_to_remove.
  super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_70 = (shared_ptr<kratos::Stmt> *)stmt;
  r.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  for (uVar7 = 0;
      psVar4 = stmts_to_remove.
               super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
               ._M_impl.super__Vector_impl_data._M_start, auVar6 = auStack_68,
      lVar1 - lVar2 >> 4 != uVar7; uVar7 = uVar7 + 1) {
    StmtBlock::get_stmt((StmtBlock *)local_90,*in_RDX);
    std::__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> *)
               &st.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> *)local_90);
    dispatch_node((RemoveEmptyBlockVisitor *)
                  &stmts_to_remove.
                   super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,local_70);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78);
    if (stmts_to_remove.
        super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
      std::vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>::
      emplace_back<std::shared_ptr<kratos::Stmt>&>
                ((vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>
                  *)auStack_68,(shared_ptr<kratos::Stmt> *)local_90);
    }
    else {
      StmtBlock::set_child
                ((StmtBlock *)*in_RDX,uVar7,
                 (shared_ptr<kratos::Stmt> *)
                 &stmts_to_remove.
                  super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&r);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&st);
  }
  for (; _Var5._M_pi = r.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi, pp_Var3 = (_func_int **)*in_RDX, auVar6 != (undefined1  [8])psVar4;
      auVar6 = (undefined1  [8])((long)auVar6 + 0x10)) {
    (**(code **)(*pp_Var3 + 0x50))(pp_Var3,auVar6);
  }
  if (pp_Var3[0x18] == pp_Var3[0x19]) {
    (r.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
    _vptr__Sp_counted_base = (_func_int **)0x0;
    (r.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count
         = 0;
    (r.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
    _M_weak_count = 0;
  }
  else {
    (r.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
    _vptr__Sp_counted_base = pp_Var3;
    uVar7 = in_RDX[1];
    in_RDX[1] = 0;
    (r.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count
         = (int)uVar7;
    (r.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
    _M_weak_count = (int)(uVar7 >> 0x20);
    *in_RDX = 0;
  }
  std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::
  ~vector((vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_> *)
          auStack_68);
  sVar8.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar8.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var5._M_pi;
  return (shared_ptr<kratos::StmtBlock>)
         sVar8.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<StmtBlock> process(std::shared_ptr<StmtBlock> stmt) {
        auto stmt_count = stmt->size();
        std::vector<std::shared_ptr<Stmt>> stmts_to_remove;
        for (uint64_t i = 0; i < stmt_count; i++) {
            auto st = stmt->get_stmt(i);
            auto r = dispatch_node(st);
            if (!r) {
                stmts_to_remove.emplace_back(st);
                continue;
            }
            stmt->set_child(i, r);
        }
        for (auto const& st : stmts_to_remove) {
            stmt->remove_stmt(st);
        }
        if (stmt->empty())
            return nullptr;
        else
            return stmt;
    }